

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PltFileManager.cpp
# Opt level: O2

void __thiscall
pele::physics::pltfilemanager::PltFileManager::fillPatchFromPlt
          (PltFileManager *this,int a_lev,Geometry *a_level_geom,int pltComp,int dataComp,int nComp,
          MultiFab *a_mf)

{
  int *this_00;
  ulong uVar1;
  Geometry *pGVar2;
  bool bVar3;
  long lVar4;
  Periodicity *pPVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  _Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *p_Var9;
  _Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *p_Var10;
  long lVar11;
  Box *this_01;
  int iVar12;
  PltFileManager *pPVar13;
  IntVect IVar14;
  IntVect IVar15;
  initializer_list<amrex::MultiFab_*> __l;
  initializer_list<double> __l_00;
  initializer_list<amrex::MultiFab_*> __l_01;
  initializer_list<double> __l_02;
  initializer_list<amrex::MultiFab_*> __l_03;
  initializer_list<double> __l_04;
  allocator_type local_44a;
  allocator_type local_449;
  PltFileManager *local_448;
  long local_440;
  pointer *local_438;
  long local_430;
  _Vector_base<double,_std::allocator<double>_> local_428;
  IntVect local_410;
  long local_400;
  pointer *local_3f8;
  _Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *local_3f0;
  IntVect local_3e8;
  Box *local_3d8;
  Geometry *local_3d0;
  ulong local_3c8;
  MultiFab *local_3c0;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> dummyBCRec;
  IntVect local_398;
  double local_388;
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> local_380;
  undefined1 local_298 [232];
  MultiFab temp;
  
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
            (&dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,(long)nComp,
             (allocator_type *)&temp);
  lVar4 = 0;
  uVar7 = 0;
  if (0 < nComp) {
    uVar7 = (ulong)(uint)nComp;
  }
  lVar8 = 0xc;
  for (; lVar4 != 3; lVar4 = lVar4 + 1) {
    if (*(char *)((long)(a_level_geom->super_CoordSys).inv_dx + lVar4 + 0x19) == '\0') {
      for (lVar11 = 0; uVar7 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
        *(undefined4 *)
         ((long)(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_start)->bc + lVar11 + lVar8 + -0xc) = 2;
        *(undefined4 *)
         ((long)(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_start)->bc + lVar11 + lVar8) = 2;
      }
    }
    else {
      for (lVar11 = 0; uVar7 * 0x18 - lVar11 != 0; lVar11 = lVar11 + 0x18) {
        *(undefined4 *)
         ((long)(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_start)->bc + lVar11 + lVar8 + -0xc) = 0;
        *(undefined4 *)
         ((long)(dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>.
                 super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
                 super__Vector_impl_data._M_start)->bc + lVar11 + lVar8) = 0;
      }
    }
    lVar8 = lVar8 + 4;
  }
  local_448 = this;
  local_3d0 = a_level_geom;
  local_3c8 = (ulong)(uint)nComp;
  if (a_lev == 0) {
    bVar3 = amrex::RealBox::contains
                      (&((this->m_geoms).
                         super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                         _M_impl.super__Vector_impl_data._M_start)->prob_domain,
                       &a_level_geom->prob_domain,1e-07);
    if (!bVar3) {
      amrex::Assert_host("m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001)",
                         "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/PelePhysics/Utility/PltFileManager/PltFileManager.cpp"
                         ,0xd3,(char *)0x0);
    }
    IVar14 = amrex::Box::size(&a_level_geom->domain);
    IVar15 = amrex::Box::size(&((this->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->domain);
    pGVar2 = local_3d0;
    uVar7 = (long)((ulong)(uint)(IVar14.vect[0] >> 0x1f) << 0x20 | IVar14.vect._0_8_ & 0xffffffff) /
            (long)IVar15.vect[0];
    lVar4 = (long)((ulong)(uint)(IVar14.vect[1] >> 0x1f) << 0x20 | IVar14.vect._0_8_ >> 0x20) /
            (long)IVar15.vect[1];
    local_398.vect[2] = IVar14.vect[2] / IVar15.vect[2];
    local_398.vect._0_8_ = lVar4 << 0x20 | uVar7 & 0xffffffff;
    iVar6 = (int)uVar7;
    iVar12 = (int)lVar4;
    if (((iVar6 == 1) && (iVar12 == 1)) && (local_398.vect[2] == 1)) {
      memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *
             )&temp,local_3d0,200);
      this_00 = temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2;
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)this_00,
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_428._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      local_410.vect._0_8_ =
           (this->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
           super__Vector_impl_data._M_start;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_410;
      std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_298,__l,
                 (allocator_type *)&local_3c0);
      local_3e8.vect[0] = 0;
      local_3e8.vect[1] = 0;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_3e8;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_380,__l_00,
                 (allocator_type *)&local_388);
      amrex::
      FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                (a_mf,(IntVect *)&local_428,0.0,
                 (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_298,
                 (Vector<double,_std::allocator<double>_> *)&local_380,pltComp,dataComp,nComp,pGVar2
                 ,(PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                   *)&temp,0);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&local_380);
      std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)local_298);
      std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)this_00);
    }
    else {
      if (iVar12 < iVar6) {
        iVar12 = iVar6;
      }
      if (iVar12 <= local_398.vect[2]) {
        iVar12 = local_398.vect[2];
      }
      if (iVar12 < 2) {
        amrex::Abort_host(
                         "When initializing dataFromPlt, our level 0 can\'t be coarser than the PltFile one"
                         );
      }
      else {
        memcpy(&temp,(this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                     .super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_start,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        pGVar2 = local_3d0;
        memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)local_298,local_3d0,200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200),
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
        local_380.m_geom.super_CoordSys.offset[0] =
             (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
        amrex::
        InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                  (a_mf,(IntVect *)&local_380,0.0,
                   (local_448->m_data).
                   super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                   super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
                   super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
                   (local_448->m_geoms).
                   super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_start,pGVar2,
                   (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)&temp,0,
                   (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)local_298,0,&local_398,(InterpBase *)amrex::mf_cell_cons_interp,
                   (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                   (NullInterpHook<amrex::FArrayBox> *)&local_428,
                   (NullInterpHook<amrex::FArrayBox> *)&local_410);
        std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                  ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200));
        std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                  ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                   (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2));
        uVar7 = local_3c8;
        this_01 = (Box *)(local_298 + 200);
        local_438 = (pointer *)&local_380.m_bcr;
        lVar4 = 0x180;
        p_Var9 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x10;
        local_430 = 0x68;
        local_440 = 200;
        p_Var10 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x1;
        local_3d8 = this_01;
        while (pPVar13 = local_448,
              (long)p_Var10 <
              ((long)(local_448->m_geoms).
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(local_448->m_geoms).
                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                    super__Vector_impl_data._M_start) / 200) {
          local_400 = lVar4;
          local_3f0 = p_Var10;
          IVar14 = amrex::Box::size(&a_level_geom->domain);
          IVar15 = amrex::Box::size((Box *)((long)&(((pPVar13->m_geoms).
                                                                                                          
                                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  .
                                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->domain
                                                  ).smallend + local_440));
          pPVar13 = local_448;
          uVar1 = (long)((ulong)(uint)(IVar14.vect[0] >> 0x1f) << 0x20 |
                        IVar14.vect._0_8_ & 0xffffffff) / (long)IVar15.vect[0];
          lVar4 = (long)((ulong)(uint)(IVar14.vect[1] >> 0x1f) << 0x20 | IVar14.vect._0_8_ >> 0x20)
                  / (long)IVar15.vect[1];
          local_410.vect[2] = IVar14.vect[2] / IVar15.vect[2];
          local_410.vect._0_8_ = lVar4 << 0x20 | uVar1 & 0xffffffff;
          if ((((int)uVar1 == 1) && ((int)lVar4 == 1)) && (local_410.vect[2] == 1)) {
            local_298._0_8_ = (pointer)0x1;
            local_298._8_8_ = 0.0;
            local_298._16_8_ = 0.0;
            local_298._24_8_ = 0.0;
            local_298._32_8_ = 0.0;
            local_380.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_006d8928;
            iVar12 = (int)local_3c8;
            amrex::MultiFab::MultiFab
                      (&temp,(BoxArray *)
                             ((long)&(((local_448->m_grids).
                                       super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       .
                                       super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type
                             + local_430),
                       (DistributionMapping *)
                       ((long)&(((local_448->m_dmaps).
                                 super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 .
                                 super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                       + (long)p_Var9),iVar12,0,(MFInfo *)local_298,
                       (FabFactory<amrex::FArrayBox> *)&local_380);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(local_298 + 0x10));
            memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)local_298,
                   (void *)((long)(((pPVar13->m_geoms).
                                    super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                    super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).
                                  offset + local_440 + 0xfffffffffffffff8U),200);
            std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                      ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200),
                       &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
            local_3e8.vect[0] = 0;
            local_3e8.vect[1] = 0;
            local_3e8.vect[2] = 0;
            local_3c0 = (MultiFab *)
                        ((long)&(((pPVar13->m_data).
                                  super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                                  super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->
                                super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_400);
            __l_03._M_len = 1;
            __l_03._M_array = &local_3c0;
            std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                      ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                       __l_03,&local_449);
            local_388 = 0.0;
            __l_04._M_len = 1;
            __l_04._M_array = &local_388;
            std::vector<double,_std::allocator<double>_>::vector
                      ((vector<double,_std::allocator<double>_> *)&local_428,__l_04,&local_44a);
            amrex::
            FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                      (&temp,&local_3e8,0.0,
                       (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                       (Vector<double,_std::allocator<double>_> *)&local_428,pltComp,0,iVar12,
                       (Geometry *)
                       ((long)(((local_448->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                       local_440 + 0xfffffffffffffff8U),
                       (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                        *)local_298,0);
            std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_428);
            std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                      ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)
                       &local_380);
            pPVar5 = amrex::Periodicity::NonPeriodic();
            amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                      (&a_mf->super_FabArray<amrex::FArrayBox>,
                       &temp.super_FabArray<amrex::FArrayBox>,0,dataComp,iVar12,pPVar5,COPY);
            goto LAB_00395fe1;
          }
          amrex::refine((BoxArray *)local_298,
                        (BoxArray *)
                        ((long)&(((local_448->m_grids).
                                  super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                        local_430),&local_410);
          local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
          local_380.m_geom.super_CoordSys.offset[2] = 0.0;
          local_380.m_geom.super_CoordSys.dx[0] = 0.0;
          local_380.m_geom.super_CoordSys.offset[0] = 0.0;
          local_380.m_geom.super_CoordSys.offset[1] = 0.0;
          local_428._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_006d8928;
          iVar12 = (int)uVar7;
          local_3f8 = (pointer *)p_Var9;
          amrex::MultiFab::MultiFab
                    (&temp,(BoxArray *)local_298,
                     (DistributionMapping *)
                     ((long)&(((pPVar13->m_dmaps).
                               super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               .
                               super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                     + (long)p_Var9),iVar12,0,(MFInfo *)&local_380,
                     (FabFactory<amrex::FArrayBox> *)&local_428);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(local_380.m_geom.super_CoordSys.offset + 1));
          amrex::BoxArray::~BoxArray((BoxArray *)local_298);
          memcpy((BoxArray *)local_298,
                 (void *)((long)(((pPVar13->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + local_440 + 0xfffffffffffffff8U),200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)this_01,
                     &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
          pGVar2 = local_3d0;
          memcpy(&local_380,local_3d0,200);
          std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                    ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_438,
                     &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
          lVar4 = local_400;
          local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_428._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          amrex::
          InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                    ((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>,(IntVect *)&local_428,0.0,
                     (MultiFab *)
                     ((long)&(((local_448->m_data).
                               super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_400),
                     pltComp,0,iVar12,
                     (Geometry *)
                     ((long)(((local_448->m_geoms).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     local_440 + 0xfffffffffffffff8U),pGVar2,
                     (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                      *)local_298,0,&local_380,0,&local_410,(InterpBase *)amrex::mf_cell_cons_interp
                     ,(Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                      &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                     (NullInterpHook<amrex::FArrayBox> *)&local_3e8,
                     (NullInterpHook<amrex::FArrayBox> *)&local_3c0);
          pPVar5 = amrex::Periodicity::NonPeriodic();
          this_01 = local_3d8;
          amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                    (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,
                     0,dataComp,iVar12,pPVar5,COPY);
          std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                    ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_438);
          std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                    ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)this_01);
          amrex::MultiFab::~MultiFab((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>);
          local_440 = local_440 + 200;
          lVar4 = lVar4 + 0x180;
          p_Var9 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_3f8 + 2);
          local_430 = local_430 + 0x68;
          p_Var10 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                    ((long)&(((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                             &local_3f0->_M_impl)->_M_impl).super__Vector_impl_data._M_start + 1);
        }
      }
    }
  }
  else {
    local_3d8 = &a_level_geom->domain;
    IVar14 = amrex::Box::size(local_3d8);
    IVar15 = amrex::Box::size(&((this->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->domain);
    local_398.vect[2] = IVar14.vect[2] / IVar15.vect[2];
    local_398.vect._0_8_ =
         (long)((ulong)(uint)(IVar14.vect[1] >> 0x1f) << 0x20 | IVar14.vect._0_8_ >> 0x20) /
         (long)IVar15.vect[1] << 0x20 |
         (long)((ulong)(uint)(IVar14.vect[0] >> 0x1f) << 0x20 | IVar14.vect._0_8_ & 0xffffffff) /
         (long)IVar15.vect[0] & 0xffffffffU;
    memcpy(&temp,(this->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                 super__Vector_impl_data._M_start,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2),
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *)
           local_298,a_level_geom,200);
    std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
              ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200),
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
    local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x0;
    local_380.m_geom.super_CoordSys.offset[0] =
         (Real)((ulong)local_380.m_geom.super_CoordSys.offset[0]._4_4_ << 0x20);
    amrex::
    InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
              (a_mf,(IntVect *)&local_380,0.0,
               (local_448->m_data).super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
               super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>._M_impl.
               super__Vector_impl_data._M_start,pltComp,dataComp,nComp,
               (local_448->m_geoms).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_start,a_level_geom,
               (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)&temp,0,
               (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)local_298,0,&local_398,(InterpBase *)amrex::mf_cell_cons_interp,
               (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
               (NullInterpHook<amrex::FArrayBox> *)&local_428,
               (NullInterpHook<amrex::FArrayBox> *)&local_410);
    local_438 = (pointer *)0x10;
    local_430 = 0x68;
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200));
    std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
              ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
               (temp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect + 2));
    local_3f0 = (_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200);
    local_3f8 = (pointer *)&local_380.m_bcr;
    local_400 = 0x180;
    local_440 = 200;
    pPVar13 = local_448;
    for (lVar4 = 1;
        lVar4 < ((long)(pPVar13->m_geoms).
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_finish -
                (long)(pPVar13->m_geoms).
                      super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                      super__Vector_impl_data._M_start) / 200; lVar4 = lVar4 + 1) {
      IVar14 = amrex::Box::size(local_3d8);
      lVar11 = local_440;
      IVar15 = amrex::Box::size((Box *)((long)&(((pPVar13->m_geoms).
                                                 super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                 .
                                                 super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->domain)
                                               .smallend + local_440));
      pPVar13 = local_448;
      uVar7 = (long)((ulong)(uint)(IVar14.vect[0] >> 0x1f) << 0x20 | IVar14.vect._0_8_ & 0xffffffff)
              / (long)IVar15.vect[0];
      lVar8 = (long)((ulong)(uint)(IVar14.vect[1] >> 0x1f) << 0x20 | IVar14.vect._0_8_ >> 0x20) /
              (long)IVar15.vect[1];
      local_410.vect[2] = IVar14.vect[2] / IVar15.vect[2];
      local_410.vect._0_8_ = lVar8 << 0x20 | uVar7 & 0xffffffff;
      if ((((int)uVar7 == 1) && ((int)lVar8 == 1)) && (local_410.vect[2] == 1)) {
        local_298._0_8_ = (pointer)0x1;
        local_298._8_8_ = 0.0;
        local_298._16_8_ = 0.0;
        local_298._24_8_ = 0.0;
        local_298._32_8_ = 0.0;
        local_380.m_geom.super_CoordSys._0_8_ = &PTR__FabFactory_006d8928;
        iVar12 = (int)local_3c8;
        amrex::MultiFab::MultiFab
                  (&temp,(BoxArray *)
                         ((long)&(((local_448->m_grids).
                                   super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                         local_430),
                   (DistributionMapping *)
                   ((long)&(((local_448->m_dmaps).
                             super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             .
                             super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                   + (long)&(((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_438
                             )->_M_impl).super__Vector_impl_data._M_start),iVar12,0,
                   (MFInfo *)local_298,(FabFactory<amrex::FArrayBox> *)&local_380);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_298 + 0x10));
        memcpy((PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                *)local_298,
               (void *)((long)(((pPVar13->m_geoms).
                                super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                       lVar11 + 0xfffffffffffffff8U),200);
        std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                  ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200),
                   &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
        local_3e8.vect[0] = 0;
        local_3e8.vect[1] = 0;
        local_3e8.vect[2] = 0;
        local_3c0 = (MultiFab *)
                    ((long)&(((pPVar13->m_data).
                              super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                              super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                              _M_impl.super__Vector_impl_data._M_start)->
                            super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_400);
        __l_01._M_len = 1;
        __l_01._M_array = &local_3c0;
        std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
                  ((vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                   __l_01,&local_449);
        local_388 = 0.0;
        __l_02._M_len = 1;
        __l_02._M_array = &local_388;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_428,__l_02,&local_44a);
        amrex::
        FillPatchSingleLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>>
                  (&temp,&local_3e8,0.0,
                   (Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380,
                   (Vector<double,_std::allocator<double>_> *)&local_428,pltComp,0,iVar12,
                   (Geometry *)
                   ((long)(((pPVar13->m_geoms).
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                   local_440 + 0xfffffffffffffff8U),
                   (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                    *)local_298,0);
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_428);
        std::_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::~_Vector_base
                  ((_Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_380
                  );
        pPVar5 = amrex::Periodicity::NonPeriodic();
        amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                  (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,0,
                   dataComp,iVar12,pPVar5,COPY);
LAB_00395fe1:
        std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                  ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)(local_298 + 200));
        amrex::MultiFab::~MultiFab(&temp);
        break;
      }
      amrex::refine((BoxArray *)local_298,
                    (BoxArray *)
                    ((long)&(((local_448->m_grids).
                              super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                              _M_impl.super__Vector_impl_data._M_start)->m_bat).m_bat_type +
                    local_430),&local_410);
      local_380.m_geom.super_CoordSys._0_8_ = (pointer)0x1;
      local_380.m_geom.super_CoordSys.offset[2] = 0.0;
      local_380.m_geom.super_CoordSys.dx[0] = 0.0;
      local_380.m_geom.super_CoordSys.offset[0] = 0.0;
      local_380.m_geom.super_CoordSys.offset[1] = 0.0;
      local_428._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__FabFactory_006d8928;
      iVar12 = (int)local_3c8;
      amrex::MultiFab::MultiFab
                (&temp,(BoxArray *)local_298,
                 (DistributionMapping *)
                 ((long)&(((pPVar13->m_dmaps).
                           super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           .
                           super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_ref).
                         super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                 + (long)&(((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_438)
                          ->_M_impl).super__Vector_impl_data._M_start),iVar12,0,(MFInfo *)&local_380
                 ,(FabFactory<amrex::FArrayBox> *)&local_428);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_380.m_geom.super_CoordSys.offset + 1));
      amrex::BoxArray::~BoxArray((BoxArray *)local_298);
      memcpy((BoxArray *)local_298,
             (void *)((long)(((pPVar13->m_geoms).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar11 + 0xfffffffffffffff8U),200);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_3f0,
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      pGVar2 = local_3d0;
      memcpy(&local_380,local_3d0,200);
      std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::vector
                ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_3f8,
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>);
      local_428._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_428._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      amrex::
      InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
                ((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>,(IntVect *)&local_428,0.0,
                 (MultiFab *)
                 ((long)&(((pPVar13->m_data).
                           super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                           _M_impl.super__Vector_impl_data._M_start)->
                         super_FabArray<amrex::FArrayBox>).super_FabArrayBase + local_400),pltComp,0
                 ,iVar12,(Geometry *)
                         ((long)(((pPVar13->m_geoms).
                                  super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                                  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset
                         + lVar11 + 0xfffffffffffffff8U),pGVar2,
                 (PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>
                  *)local_298,0,&local_380,0,&local_410,(InterpBase *)amrex::mf_cell_cons_interp,
                 (Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                 &dummyBCRec.super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,0,
                 (NullInterpHook<amrex::FArrayBox> *)&local_3e8,
                 (NullInterpHook<amrex::FArrayBox> *)&local_3c0);
      pPVar5 = amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                (&a_mf->super_FabArray<amrex::FArrayBox>,&temp.super_FabArray<amrex::FArrayBox>,0,
                 dataComp,iVar12,pPVar5,COPY);
      std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
                ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_3f8);
      std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base(local_3f0);
      amrex::MultiFab::~MultiFab((MultiFab *)&temp.super_FabArray<amrex::FArrayBox>);
      local_440 = local_440 + 200;
      local_400 = local_400 + 0x180;
      local_438 = &(((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)local_438)->
                   _M_impl).super__Vector_impl_data._M_end_of_storage;
      local_430 = local_430 + 0x68;
    }
  }
  std::_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~_Vector_base
            ((_Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)&dummyBCRec);
  return;
}

Assistant:

void
PltFileManager::fillPatchFromPlt(
  int a_lev,
  const Geometry& a_level_geom,
  int pltComp,
  int dataComp,
  int nComp,
  MultiFab& a_mf)
{
  Vector<BCRec> dummyBCRec(nComp);
  for (int idim = 0; idim < AMREX_SPACEDIM; idim++) {
    if (a_level_geom.isPeriodic(idim)) {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::int_dir);
        dummyBCRec[n].setHi(idim, BCType::int_dir);
      }
    } else {
      for (int n = 0; n < nComp; n++) {
        dummyBCRec[n].setLo(idim, BCType::foextrap);
        dummyBCRec[n].setHi(idim, BCType::foextrap);
      }
    }
  }

  // There might be a number of problems related to proper nesting of the
  // current BA and the PltFile BA. Try to address some of those, but need
  // further testing.

  if (a_lev == 0) {
    // Ensure that the provided level 0 geometry is contained in the one
    // we've read from the pltfile
    AMREX_ALWAYS_ASSERT(
      m_geoms[0].ProbDomain().contains(a_level_geom.ProbDomain(), 0.0000001));

    // Check the refRatio between PltFile level 0 and ours
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Same domain size, just do a fill patch single level
    if (lev0rr == IntVect::TheUnitVector()) {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      FillPatchSingleLevel(
        a_mf, IntVect(0), 0.0, {&(m_data[a_lev])}, {0.0}, pltComp, dataComp,
        nComp, a_level_geom, bndry_func, 0);

      // Our level 0 is finer than the PltFile one.
    } else if (lev0rr.max() > 1) {

      // Interpolator (need EB version ?)
      InterpBase* mapper = &mf_cell_cons_interp;

      // Start by filling all the data with a coarseInterp. We've checked that
      // the geom RealBoxes match already, so PltFile level 0 is good to interp.
      {
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp,
          m_geoms[0], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          lev0rr, mapper, {dummyBCRec}, 0);
      }

      // Then get data from the PltFile finer levels if any
      for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

        IntVect rr =
          a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

        // Current Plt level resolution matches our: lets interp and wrap it up
        if (rr == IntVect::TheUnitVector()) {
          MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
          PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
            m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
          FillPatchSingleLevel(
            temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
            m_geoms[pltlev], bndry_func, 0);

          a_mf.ParallelCopy(temp, 0, dataComp, nComp);

          break;
        }

        // Otherwise do another InterpFromCoarseLevel
        MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
          a_level_geom, {dummyBCRec}, FillExtDirDummy{});
        InterpFromCoarseLevel(
          temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
          m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
          rr, mapper, {dummyBCRec}, 0);
        a_mf.ParallelCopy(temp, 0, dataComp, nComp);
      }

    } else {
      // Otherwise bail out because we don't handle averaging_down (TODO ?)
      Abort("When initializing dataFromPlt, our level 0 can't be coarser than "
            "the PltFile one");
    }
  } else {
    // Check the refRatio between PltFile level 0 and the current level
    IntVect lev0rr = a_level_geom.Domain().size() / m_geoms[0].Domain().size();

    // Interpolator (need EB version ?)
    InterpBase* mapper = &mf_cell_cons_interp;

    // Start by filling the entire level with level 0 from PltFile, to ensure we
    // have some data everywhere
    {
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[0], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        a_mf, IntVect(0), 0.0, m_data[0], pltComp, dataComp, nComp, m_geoms[0],
        a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0, lev0rr, mapper,
        {dummyBCRec}, 0);
    }

    // Then get data from the PltFile finer levels if any
    for (int pltlev = 1; pltlev < m_geoms.size(); pltlev++) {

      IntVect rr =
        a_level_geom.Domain().size() / m_geoms[pltlev].Domain().size();

      // Current Plt level resolution matches our: lets interp and wrap it up
      if (rr == IntVect::TheUnitVector()) {
        MultiFab temp(m_grids[pltlev], m_dmaps[pltlev], nComp, 0);
        PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> bndry_func(
          m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
        FillPatchSingleLevel(
          temp, IntVect(0), 0.0, {&m_data[pltlev]}, {0.0}, pltComp, 0, nComp,
          m_geoms[pltlev], bndry_func, 0);

        a_mf.ParallelCopy(temp, 0, dataComp, nComp);

        break;
      }

      // Otherwise do another InterpFromCoarseLevel
      MultiFab temp(refine(m_grids[pltlev], rr), m_dmaps[pltlev], nComp, 0);
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> crse_bndry_func(
        m_geoms[pltlev], {dummyBCRec}, FillExtDirDummy{});
      PhysBCFunct<GpuBndryFuncFab<FillExtDirDummy>> fine_bndry_func(
        a_level_geom, {dummyBCRec}, FillExtDirDummy{});
      InterpFromCoarseLevel(
        temp, IntVect(0), 0.0, m_data[pltlev], pltComp, 0, nComp,
        m_geoms[pltlev], a_level_geom, crse_bndry_func, 0, fine_bndry_func, 0,
        rr, mapper, {dummyBCRec}, 0);
      a_mf.ParallelCopy(temp, 0, dataComp, nComp);
    }
  }
}